

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall
t_js_generator::generate_js_struct_writer(t_js_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  undefined4 extraout_var;
  members_type *this_00;
  ostream *poVar4;
  t_program *p;
  string *psVar5;
  reference pptVar6;
  string *psVar7;
  t_type *type;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  allocator local_f1;
  string local_f0;
  string local_d0;
  string local_b0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  t_field **local_88;
  string local_80;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_60;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  t_struct *tstruct_local;
  ostream *out_local;
  t_js_generator *this_local;
  
  name.field_2._8_8_ = tstruct;
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar2));
  this_00 = t_struct::get_members((t_struct *)name.field_2._8_8_);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_60);
  if ((this->gen_es6_ & 1U) == 0) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    p = t_type::get_program((t_type *)name.field_2._8_8_);
    js_namespace_abi_cxx11_(&local_80,this,p);
    poVar4 = std::operator<<(poVar4,(string *)&local_80);
    psVar5 = (string *)(**(code **)(*(long *)name.field_2._8_8_ + 0x18))();
    poVar4 = std::operator<<(poVar4,psVar5);
    poVar4 = std::operator<<(poVar4,".prototype.write = function(output) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"write (output) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"output.writeStructBegin(\'");
  poVar4 = std::operator<<(poVar4,(string *)&fields);
  poVar4 = std::operator<<(poVar4,"\');");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_88 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  local_60._M_current = local_88;
  while( true ) {
    local_90._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=(&local_60,&local_90);
    if (!bVar1) break;
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_b0);
    poVar4 = std::operator<<(poVar4,"if (this.");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4," !== null && this.");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4," !== undefined) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
    t_generator::indent_up((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"output.writeFieldBegin(");
    poVar4 = std::operator<<(poVar4,"\'");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar6);
    poVar4 = std::operator<<(poVar4,(string *)psVar7);
    poVar4 = std::operator<<(poVar4,"\', ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    type = t_field::get_type(*pptVar6);
    type_to_enum_abi_cxx11_(&local_d0,this,type);
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    poVar4 = std::operator<<(poVar4,", ");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    iVar3 = t_field::get_key(*pptVar6);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_60);
    tfield = *pptVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"this.",&local_f1);
    generate_serialize_field(this,out,tfield,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"output.writeFieldEnd();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_60);
  }
  t_generator::indent_abi_cxx11_(&local_118,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_118);
  poVar4 = std::operator<<(poVar4,"output.writeFieldStop();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_138);
  poVar4 = std::operator<<(poVar4,"output.writeStructEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_158);
  poVar4 = std::operator<<(poVar4,"return;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_158);
  t_generator::indent_down((t_generator *)this);
  if ((this->gen_es6_ & 1U) == 0) {
    t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_198);
    poVar4 = std::operator<<(poVar4,"};");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_198);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_178);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_178);
  }
  std::__cxx11::string::~string((string *)&fields);
  return;
}

Assistant:

void t_js_generator::generate_js_struct_writer(ostream& out, t_struct* tstruct) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_es6_) {
    indent(out) << "write (output) {" << endl;
  } else {
    indent(out) << js_namespace(tstruct->get_program()) << tstruct->get_name()
        << ".prototype.write = function(output) {" << endl;
  }

  indent_up();

  indent(out) << "output.writeStructBegin('" << name << "');" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    out << indent() << "if (this." << (*f_iter)->get_name() << " !== null && this."
        << (*f_iter)->get_name() << " !== undefined) {" << endl;
    indent_up();

    indent(out) << "output.writeFieldBegin("
                << "'" << (*f_iter)->get_name() << "', " << type_to_enum((*f_iter)->get_type())
                << ", " << (*f_iter)->get_key() << ");" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    indent(out) << "output.writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}" << endl;
  }

  out << indent() << "output.writeFieldStop();" << endl << indent() << "output.writeStructEnd();"
      << endl;

  out << indent() << "return;" << endl;

  indent_down();
  if (gen_es6_) {
    out << indent() << "}" << endl << endl;
  } else {
    out << indent() << "};" << endl << endl;
  }
}